

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

BOOL CONTEXT_GetRegisters(DWORD processId,LPCONTEXT lpContext)

{
  uint __errnum;
  FILE *__stream;
  DWORD DVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  undefined1 local_498 [8];
  ucontext_t registers;
  pt_regs ptrace_registers;
  
  DVar1 = GetCurrentProcessId();
  if (DVar1 == processId) {
    CONTEXT_CaptureContext(lpContext);
  }
  else {
    lVar2 = ptrace(PTRACE_GETREGS,(ulong)processId,registers.__ssp + 3,0);
    if (lVar2 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_GetRegisters",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x166);
      __stream = _stderr;
      puVar3 = (uint *)__errno_location();
      __errnum = *puVar3;
      pcVar4 = strerror(__errnum);
      fprintf(__stream,"Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",(ulong)processId,
              (ulong)__errnum,pcVar4);
    }
    registers.uc_mcontext.gregs[6] = registers.__ssp[3];
    CONTEXTFromNativeContext((native_context_t *)local_498,lpContext,lpContext->ContextFlags);
  }
  return 1;
}

Assistant:

BOOL CONTEXT_GetRegisters(DWORD processId, LPCONTEXT lpContext)
{
#if HAVE_BSD_REGS_T
    int regFd = -1;
#endif  // HAVE_BSD_REGS_T
    BOOL bRet = FALSE;

    if (processId == GetCurrentProcessId())
    {
        CONTEXT_CaptureContext(lpContext);
    }
    else
    {
        ucontext_t registers;
#if HAVE_PT_REGS
        struct pt_regs ptrace_registers;
        if (ptrace((__ptrace_request)PTRACE_GETREGS, processId, (caddr_t) &ptrace_registers, 0) == -1)
#elif HAVE_BSD_REGS_T
        struct reg ptrace_registers;
        if (PAL_PTRACE(PT_GETREGS, processId, &ptrace_registers, 0) == -1)
#endif
        {
            ASSERT("Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",
                   processId, errno, strerror(errno));
        }

#if HAVE_PT_REGS
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = PTREG_##reg(ptrace_registers);
#elif HAVE_BSD_REGS_T
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = BSDREG_##reg(ptrace_registers);
#else
#define ASSIGN_REG(reg)
	ASSERT("Don't know how to get the context of another process on this platform!");
	return bRet;
#endif
        ASSIGN_ALL_REGS
#undef ASSIGN_REG

        CONTEXTFromNativeContext(&registers, lpContext, lpContext->ContextFlags);
    }

    bRet = TRUE;
#if HAVE_BSD_REGS_T
    if (regFd != -1)
    {
        close(regFd);
    }
#endif  // HAVE_BSD_REGS_T
    return bRet;
}